

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_header.cpp
# Opt level: O3

void __thiscall BamTools::HeaderTool::~HeaderTool(HeaderTool *this)

{
  HeaderSettings *pHVar1;
  pointer pcVar2;
  
  (this->super_AbstractTool)._vptr_AbstractTool = (_func_int **)&PTR__HeaderTool_001f1080;
  pHVar1 = this->m_settings;
  if (pHVar1 != (HeaderSettings *)0x0) {
    pcVar2 = (pHVar1->InputFilelist)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != &(pHVar1->InputFilelist).field_2) {
      operator_delete(pcVar2);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&pHVar1->InputFiles);
  }
  operator_delete(pHVar1);
  this->m_settings = (HeaderSettings *)0x0;
  operator_delete(this->m_impl);
  this->m_impl = (HeaderToolPrivate *)0x0;
  return;
}

Assistant:

HeaderTool::~HeaderTool()
{

    delete m_settings;
    m_settings = 0;

    delete m_impl;
    m_impl = 0;
}